

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Performance::ShaderCompilerCase::goodEnoughMeasurements
          (ShaderCompilerCase *this,
          vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
          *measurements)

{
  pointer pMVar1;
  int iVar2;
  bool bVar3;
  pointer pMVar4;
  long lVar5;
  int i;
  long lVar6;
  float fVar7;
  vector<long,_std::allocator<long>_> totalTimesWithoutDraw;
  _Vector_base<long,_std::allocator<long>_> local_60;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  pMVar4 = (measurements->
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (measurements->
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = (int)((ulong)((long)pMVar1 - (long)pMVar4) >> 6);
  if (iVar2 < this->m_minimumMeasurementCount) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (iVar2 < this->m_maximumMeasurementCount) {
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < (int)((ulong)((long)pMVar1 - (long)pMVar4) >> 6); lVar6 = lVar6 + 1) {
        local_60._M_impl.super__Vector_impl_data._M_start =
             (pointer)Measurement::totalTimeWithoutDraw
                                ((Measurement *)((long)&pMVar4->sourceSetTime + lVar5));
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  ((vector<long,_std::allocator<long>_> *)&local_48,(long *)&local_60);
        pMVar4 = (measurements->
                 super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar1 = (measurements->
                 super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar5 = lVar5 + 0x40;
      }
      vectorLowestPercentage<long>
                ((vector<long,_std::allocator<long>_> *)&local_60,
                 (vector<long,_std::allocator<long>_> *)&local_48,0.5);
      fVar7 = vectorFloatRelativeMedianAbsoluteDeviation<long>
                        ((vector<long,_std::allocator<long>_> *)&local_60);
      bVar3 = fVar7 < 0.05;
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
    }
  }
  return bVar3;
}

Assistant:

bool ShaderCompilerCase::goodEnoughMeasurements (const vector<Measurement>& measurements) const
{
	if ((int)measurements.size() < m_minimumMeasurementCount)
		return false;
	else
	{
		if ((int)measurements.size() >= m_maximumMeasurementCount)
			return true;
		else
		{
			vector<deInt64> totalTimesWithoutDraw;
			for (int i = 0; i < (int)measurements.size(); i++)
				totalTimesWithoutDraw.push_back(measurements[i].totalTimeWithoutDraw());
			return vectorFloatRelativeMedianAbsoluteDeviation(vectorLowestPercentage(totalTimesWithoutDraw, 0.5f)) < RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD;
		}
	}
}